

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
::insert_column<std::initializer_list<unsigned_int>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
           *this,initializer_list<unsigned_int> *column)

{
  Index columnIndex;
  size_type sVar1;
  Dimension local_38;
  initializer_list<unsigned_int> *column_local;
  Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_false,_true>_>_>
  *this_local;
  
  columnIndex = *(Index *)(this + 0x58);
  sVar1 = std::initializer_list<unsigned_int>::size(column);
  if (sVar1 == 0) {
    local_38 = 0;
  }
  else {
    sVar1 = std::initializer_list<unsigned_int>::size(column);
    local_38 = (int)sVar1 + -1;
  }
  _insert<std::initializer_list<unsigned_int>>(this,column,columnIndex,local_38);
  *(int *)(this + 0x58) = *(int *)(this + 0x58) + 1;
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::insert_column(const Container& column)
{
  //TODO: dim not actually stored right now, so either get rid of it or store it again
  _insert(column, nextInsertIndex_, column.size() == 0 ? 0 : column.size() - 1);
  ++nextInsertIndex_;
}